

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O0

void begin_root_container(mu_Context *ctx,mu_Container *cnt)

{
  int iVar1;
  mu_Command *pmVar2;
  mu_Rect *pmVar3;
  mu_Container *cnt_local;
  mu_Context *ctx_local;
  
  if (0x1f < (ctx->container_stack).idx) {
    fprintf(_stderr,"Fatal error: %s:%d: assertion \'%s\' failed\n",
            "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/microui/microui.c"
            ,0x41d,
            "(ctx->container_stack).idx < (int) (sizeof((ctx->container_stack).items) / sizeof(*(ctx->container_stack).items))"
           );
    abort();
  }
  (ctx->container_stack).items[(ctx->container_stack).idx] = cnt;
  (ctx->container_stack).idx = (ctx->container_stack).idx + 1;
  if (0x1f < (ctx->root_list).idx) {
    fprintf(_stderr,"Fatal error: %s:%d: assertion \'%s\' failed\n",
            "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/microui/microui.c"
            ,0x41f,
            "(ctx->root_list).idx < (int) (sizeof((ctx->root_list).items) / sizeof(*(ctx->root_list).items))"
           );
    abort();
  }
  (ctx->root_list).items[(ctx->root_list).idx] = cnt;
  (ctx->root_list).idx = (ctx->root_list).idx + 1;
  pmVar2 = push_jump(ctx,(mu_Command *)0x0);
  cnt->head = pmVar2;
  iVar1 = rect_overlaps_vec2(cnt->rect,ctx->mouse_pos);
  if ((iVar1 != 0) &&
     ((ctx->next_hover_root == (mu_Container *)0x0 || (ctx->next_hover_root->zindex < cnt->zindex)))
     ) {
    ctx->next_hover_root = cnt;
  }
  if (0x1f < (ctx->clip_stack).idx) {
    fprintf(_stderr,"Fatal error: %s:%d: assertion \'%s\' failed\n",
            "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/microui/microui.c"
            ,0x42b,
            "(ctx->clip_stack).idx < (int) (sizeof((ctx->clip_stack).items) / sizeof(*(ctx->clip_stack).items))"
           );
    abort();
  }
  pmVar3 = (ctx->clip_stack).items + (ctx->clip_stack).idx;
  iVar1 = unclipped_rect.y;
  pmVar3->x = unclipped_rect.x;
  pmVar3->y = iVar1;
  iVar1 = unclipped_rect.h;
  pmVar3->w = unclipped_rect.w;
  pmVar3->h = iVar1;
  (ctx->clip_stack).idx = (ctx->clip_stack).idx + 1;
  return;
}

Assistant:

static void begin_root_container(mu_Context *ctx, mu_Container *cnt) {
  push(ctx->container_stack, cnt);
  /* push container to roots list and push head command */
  push(ctx->root_list, cnt);
  cnt->head = push_jump(ctx, NULL);
  /* set as hover root if the mouse is overlapping this container and it has a
  ** higher zindex than the current hover root */
  if (rect_overlaps_vec2(cnt->rect, ctx->mouse_pos) &&
      (!ctx->next_hover_root || cnt->zindex > ctx->next_hover_root->zindex)
  ) {
    ctx->next_hover_root = cnt;
  }
  /* clipping is reset here in case a root-container is made within
  ** another root-containers's begin/end block; this prevents the inner
  ** root-container being clipped to the outer */
  push(ctx->clip_stack, unclipped_rect);
}